

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::
allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::CommandBuffer>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  ostringstream *poVar1;
  Unique<vk::Handle<(vk::HandleType)24>_> *pUVar2;
  PlatformInterface *pPVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  VkResult value;
  pointer ppVVar7;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar8;
  VkDevice pVVar9;
  MessageBuilder *this;
  long lVar10;
  Move<vk::VkCommandBuffer_s_*> *ptr;
  Checked<vk::VkCommandBuffer_s_*> CVar11;
  long lVar12;
  char **value_00;
  VkCommandBufferAllocateInfo *this_00;
  ulong uVar13;
  ulong uVar14;
  vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> handles;
  VkCommandBufferAllocateInfo cmdBufferInfo;
  vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
  scopedHandles;
  Parameters params_local;
  Environment objEnv;
  SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_> local_270;
  AllocationCallbackRecorder recorder;
  Resources res;
  DeterministicFailAllocator objAllocator;
  
  params_local = params;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&res,"VK_KHR_maintenance1",(allocator<char> *)&recorder);
  bVar5 = hasDeviceExtension(context,(string *)&res);
  std::__cxx11::string::~string((string *)&res);
  std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::vector
            (&handles,4,(allocator_type *)&res);
  lVar10 = 0;
  do {
    ppVVar7 = handles.
              super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (lVar10 == 5) {
      std::_Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
      ~_Vector_base(&handles.
                     super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                   );
LAB_0046a27b:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&res,"Ok",(allocator<char> *)&recorder);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)&res);
LAB_0046a2a9:
      std::__cxx11::string::~string((string *)&res);
      return __return_storage_ptr__;
    }
    for (; ppVVar7 < handles.
                     super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish; ppVVar7 = ppVVar7 + 1) {
      *ppVVar7 = (VkCommandBuffer_s *)0xdededededededede;
    }
    allocator = ::vk::getSystemAllocator();
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              (&objAllocator,allocator,MODE_DO_NOT_COUNT,0);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              (&recorder,&objAllocator.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,
               0x80);
    pPVar3 = context->m_platformInterface;
    pDVar8 = Context::getDeviceInterface(context);
    pVVar9 = Context::getDevice(context);
    objEnv.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
    objEnv.programBinaries = context->m_progCollection;
    objEnv.allocationCallbacks =
         &recorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
    objEnv.maxResourceConsumers = 4;
    res.commandPool._0_8_ = context->m_testCtx->m_log;
    pUVar2 = &res.commandPool.object;
    objEnv.vkp = pPVar3;
    objEnv.vkd = pDVar8;
    objEnv.device = pVVar9;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pUVar2);
    std::operator<<((ostream *)pUVar2,"Trying to create ");
    this = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&res,
                      &allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::CommandBuffer>
                       ::numObjects);
    poVar1 = &this->m_str;
    std::operator<<((ostream *)poVar1," objects with ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," allocation");
    pcVar4 = "%s<%s";
    if (lVar10 == 1) {
      pcVar4 = ",\n\t\t";
    }
    std::operator<<((ostream *)poVar1,pcVar4 + 4);
    std::operator<<((ostream *)poVar1," passing");
    tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pUVar2);
    CommandBuffer::Resources::Resources(&res,&objEnv,&params_local);
    ::vk::DeterministicFailAllocator::reset(&objAllocator,MODE_COUNT_AND_FAIL,(deUint32)lVar10);
    ppVVar7 = handles.
              super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar13 = (ulong)((long)handles.
                           super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)handles.
                          super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3;
    cmdBufferInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
    cmdBufferInfo.pNext = (void *)0x0;
    cmdBufferInfo.commandPool.m_internal =
         res.commandPool.object.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
         m_internal;
    cmdBufferInfo.level = params.level;
    cmdBufferInfo.commandBufferCount = (deUint32)uVar13;
    value = (*pDVar8->_vptr_DeviceInterface[0x47])
                      (pDVar8,pVVar9,&cmdBufferInfo,
                       handles.
                       super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    scopedHandles.
    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scopedHandles.
    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    scopedHandles.
    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (value == VK_SUCCESS) {
      for (uVar14 = 0; (uVar13 & 0xffffffff) != uVar14; uVar14 = uVar14 + 1) {
        ptr = (Move<vk::VkCommandBuffer_s_*> *)operator_new(0x20);
        CVar11 = ::vk::refdetails::check<vk::VkCommandBuffer_s*>(ppVVar7[uVar14]);
        (ptr->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object = CVar11.object;
        (ptr->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_deviceIface = pDVar8;
        (ptr->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_device = pVVar9;
        (ptr->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_pool.m_internal =
             res.commandPool.object.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
             m_internal;
        de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>::SharedPtr(&local_270,ptr);
        std::
        vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s*>>,std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s*>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s*>>>
                  ((vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s*>>,std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s*>>>>
                    *)&scopedHandles,&local_270);
        de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>::release(&local_270);
      }
      std::
      vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
      ::~vector(&scopedHandles);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
                (&res.commandPool.object.super_RefBase<vk::Handle<(vk::HandleType)24>_>);
      res.commandPool._0_8_ = context->m_testCtx->m_log;
      pUVar2 = &res.commandPool.object;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pUVar2);
      std::operator<<((ostream *)pUVar2,"Construction of all objects succeeded! ");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pUVar2);
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&recorder);
      ::vk::DeterministicFailAllocator::~DeterministicFailAllocator(&objAllocator);
      std::_Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
      ~_Vector_base(&handles.
                     super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                   );
      if (lVar10 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&res,"Not validated: pooled objects didn\'t seem to use host memory",
                   (allocator<char> *)&recorder);
        tcu::TestStatus::pass(__return_storage_ptr__,(string *)&res);
        goto LAB_0046a2a9;
      }
      goto LAB_0046a27b;
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
    ::~vector(&scopedHandles);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
              (&res.commandPool.object.super_RefBase<vk::Handle<(vk::HandleType)24>_>);
    lVar12 = lVar10;
    if (bVar5) {
      while (lVar12 != 4) {
        ppVVar7 = handles.
                  super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar12;
        lVar12 = lVar12 + 1;
        if (*ppVVar7 != (VkCommandBuffer_s *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&res,"Some object handles weren\'t set to NULL",
                     (allocator<char> *)&cmdBufferInfo);
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)&res);
          goto LAB_0046a128;
        }
      }
    }
    if (value != VK_ERROR_OUT_OF_HOST_MEMORY) {
      scopedHandles.
      super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)::vk::getResultName(value);
      de::toString<char_const*>((string *)&cmdBufferInfo,(de *)&scopedHandles,value_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                     "Got invalid error code: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmdBufferInfo);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)&res);
      std::__cxx11::string::~string((string *)&res);
      this_00 = &cmdBufferInfo;
LAB_0046a130:
      std::__cxx11::string::~string((string *)this_00);
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&recorder);
      ::vk::DeterministicFailAllocator::~DeterministicFailAllocator(&objAllocator);
      std::_Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
      ~_Vector_base(&handles.
                     super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                   );
      return __return_storage_ptr__;
    }
    bVar6 = ::vk::validateAndLog(context->m_testCtx->m_log,&recorder,0);
    if (!bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&res,"Invalid allocation callback",(allocator<char> *)&cmdBufferInfo);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)&res);
LAB_0046a128:
      this_00 = (VkCommandBufferAllocateInfo *)&res;
      goto LAB_0046a130;
    }
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&recorder);
    ::vk::DeterministicFailAllocator::~DeterministicFailAllocator(&objAllocator);
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus allocCallbackFailMultipleObjectsTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<Move<typename Object::Type> >	ObjectTypeSp;

	static const deUint32	numObjects			= 4;
	const bool				expectNullHandles	= isNullHandleOnAllocationFailure<typename Object::Type>(context);
	deUint32				numPassingAllocs	= 0;

	{
		vector<typename Object::Type>	handles	(numObjects);
		VkResult						result	= VK_NOT_READY;

		for (; numPassingAllocs <= numObjects; ++numPassingAllocs)
		{
			ValidateQueryBits::fillBits(handles.begin(), handles.end());	// fill with garbage

			// \note We have to use the same allocator for both resource dependencies and the object under test,
			//       because pooled objects take memory from the pool.
			DeterministicFailAllocator			objAllocator(getSystemAllocator(), DeterministicFailAllocator::MODE_DO_NOT_COUNT, 0);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 recorder.getCallbacks(),
															 numObjects);

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create " << numObjects << " objects with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			{
				const typename Object::Resources res (objEnv, params);

				objAllocator.reset(DeterministicFailAllocator::MODE_COUNT_AND_FAIL, numPassingAllocs);
				const vector<ObjectTypeSp> scopedHandles = Object::createMultiple(objEnv, res, params, &handles, &result);
			}

			if (result == VK_SUCCESS)
			{
				context.getTestContext().getLog() << TestLog::Message << "Construction of all objects succeeded! " << TestLog::EndMessage;
				break;
			}
			else
			{
				if (expectNullHandles)
				{
					for (deUint32 nullNdx = numPassingAllocs; nullNdx < numObjects; ++nullNdx)
					{
						if (handles[nullNdx] != DE_NULL)
							return tcu::TestStatus::fail("Some object handles weren't set to NULL");
					}
				}

				if (result != VK_ERROR_OUT_OF_HOST_MEMORY)
					return tcu::TestStatus::fail("Got invalid error code: " + de::toString(getResultName(result)));

				if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
					return tcu::TestStatus::fail("Invalid allocation callback");
			}
		}
	}

	if (numPassingAllocs == 0)
	{
		if (isPooledObject<typename Object::Type>())
			return tcu::TestStatus::pass("Not validated: pooled objects didn't seem to use host memory");
		else
			return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	}
	else
		return tcu::TestStatus::pass("Ok");
}